

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

void __thiscall
BVSparse<Memory::JitArenaAllocator>::Clear(BVSparse<Memory::JitArenaAllocator> *this,BVIndex i)

{
  Type *pTVar1;
  byte bVar2;
  BVSparseNode *pBVar3;
  Type *local_28;
  Type *prevNextField;
  
  local_28 = (Type *)0x0;
  pBVar3 = NodeFromIndex(this,i,&local_28,false);
  if (pBVar3 != (BVSparseNode *)0x0) {
    BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
    bVar2 = (byte)i & 0x3f;
    pTVar1 = &pBVar3->data;
    pTVar1->word = pTVar1->word & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    if (pTVar1->word == 0) {
      pBVar3 = DeleteNode(this,pBVar3,false);
      *local_28 = pBVar3;
    }
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::Clear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if(current)
    {
        current->data.Clear(SparseBVUnit::Offset(i));
        if (current->data.IsEmpty())
        {
            *prevNextField = this->DeleteNode(current, false);
        }
    }
}